

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O0

void __thiscall
filtered_union_find::filtered_union_find
          (filtered_union_find *this,vector<float,_std::allocator<float>_> *_filtration)

{
  value_type_conflict6 *__value;
  size_type sVar1;
  reference pvVar2;
  vector<float,_std::allocator<float>_> *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  size_t i;
  allocator_type *__a;
  allocator_type *in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffa8;
  undefined1 *__n;
  ulong local_30;
  uint in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffe0;
  
  std::vector<float,_std::allocator<float>_>::size(in_RSI);
  std::allocator<int>::allocator((allocator<int> *)0x1c124b);
  std::vector<int,_std::allocator<int>_>::vector
            (in_RDI,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::allocator<int>::~allocator((allocator<int> *)0x1c126b);
  __a = (allocator_type *)(in_RDI + 1);
  __value = (value_type_conflict6 *)std::vector<float,_std::allocator<float>_>::size(in_RSI);
  in_stack_ffffffffffffffd8 = in_stack_ffffffffffffffd8 & 0xffffff;
  __n = &stack0xffffffffffffffda;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1c129c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI,(size_type)__n,__value,
             __a);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1c12c1);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffffe0,
             (vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  local_30 = 0;
  while( true ) {
    sVar1 = std::vector<float,_std::allocator<float>_>::size(in_RSI);
    if (sVar1 <= local_30) break;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,local_30);
    *pvVar2 = (value_type)local_30;
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

filtered_union_find(const std::vector<value_t>& _filtration)
	    : parent(_filtration.size()), rank(_filtration.size(), 0), filtration(_filtration) {
		for (size_t i = 0ul; i < _filtration.size(); ++i) parent[i] = index_t(i);
	}